

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O3

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusSignature> *list)

{
  bool bVar1;
  long in_FS_OFFSET;
  QDBusSignature local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray(arg);
  QList<QDBusSignature>::clear(list);
  bVar1 = QDBusArgument::atEnd(arg);
  while (!bVar1) {
    local_48.m_signature.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.m_signature.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.m_signature.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QDBusSignature::QDBusSignature(&local_48);
    QDBusArgument::operator>>(arg,&local_48);
    QtPrivate::QMovableArrayOps<QDBusSignature>::emplace<QDBusSignature_const&>
              ((QMovableArrayOps<QDBusSignature> *)list,(list->d).size,&local_48);
    QList<QDBusSignature>::end(list);
    if (&(local_48.m_signature.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.m_signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.m_signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_48.m_signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_48.m_signature.d.d)->super_QArrayData,2,0x10);
      }
    }
    bVar1 = QDBusArgument::atEnd(arg);
  }
  QDBusArgument::endArray(arg);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}